

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void test_qpixl_frqi_util_inv_gray_permutation<double>(void)

{
  allocator<double> *paVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  char *pcVar5;
  AssertHelper local_5a0;
  Message local_598;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_31;
  Message local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_30;
  Message local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_29;
  Message local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_28;
  Message local_518;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_27;
  Message local_4f8;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_26;
  Message local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_25;
  Message local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_24;
  Message local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_23;
  Message local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_22;
  Message local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_21;
  Message local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_20;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_19;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_18;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_17;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_16;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_15;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_14;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_13;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_12;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_11;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_10;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_9;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_7;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_6;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_4;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_3;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_198 [8];
  vector<double,_std::allocator<double>_> a_out;
  double local_178 [16];
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<double,_std::allocator<double>_> a_c;
  allocator<double> local_b9;
  double local_b8 [17];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> a;
  
  local_b8[0xe] = 15.0;
  local_b8[0xf] = 16.0;
  local_b8[0xc] = 13.0;
  local_b8[0xd] = 14.0;
  local_b8[10] = 11.0;
  local_b8[0xb] = 12.0;
  local_b8[8] = 9.0;
  local_b8[9] = 10.0;
  local_b8[6] = 7.0;
  local_b8[7] = 8.0;
  local_b8[4] = 5.0;
  local_b8[5] = 6.0;
  local_b8[2] = 3.0;
  local_b8[3] = 4.0;
  local_b8[0] = 1.0;
  local_b8[1] = 2.0;
  local_30 = local_b8;
  local_28 = 0x10;
  std::allocator<double>::allocator(&local_b9);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_20,__l_00,&local_b9);
  std::allocator<double>::~allocator(&local_b9);
  local_178[0xe] = 15.0;
  local_178[0xf] = 16.0;
  local_178[0xc] = 13.0;
  local_178[0xd] = 14.0;
  local_178[10] = 11.0;
  local_178[0xb] = 12.0;
  local_178[8] = 9.0;
  local_178[9] = 10.0;
  local_178[6] = 7.0;
  local_178[7] = 8.0;
  local_178[4] = 5.0;
  local_178[5] = 6.0;
  local_178[2] = 3.0;
  local_178[3] = 4.0;
  local_178[0] = 1.0;
  local_178[1] = 2.0;
  local_f8 = local_178;
  local_f0 = 0x10;
  paVar1 = (allocator<double> *)
           ((long)&a_out.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e8,__l,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&a_out.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_198,0x10,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::grayPermutation<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)local_20);
  qpixl::frqi::invGrayPermutation<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)local_20,
             (vector<double,_std::allocator<double>_> *)local_198);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1b0,"a_out[ 0]","a_c[ 0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,1);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,1);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1d0,"a_out[ 1]","a_c[ 1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,2);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1f0,"a_out[ 2]","a_c[ 2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,3);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,3);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_210,"a_out[ 3]","a_c[ 3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,4);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_230,"a_out[ 4]","a_c[ 4]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,5);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,5);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_250,"a_out[ 5]","a_c[ 5]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,6);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,6);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_270,"a_out[ 6]","a_c[ 6]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,7);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,7);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_290,"a_out[ 7]","a_c[ 7]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xe9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,8);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,8);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2b0,"a_out[ 8]","a_c[ 8]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xea,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,9);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,9);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2d0,"a_out[ 9]","a_c[ 9]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xeb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,10);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,10);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2f0,"a_out[10]","a_c[10]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xec,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,0xb);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xb);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_310,"a_out[11]","a_c[11]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar2) {
    testing::Message::Message(&local_318);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xed,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,0xc);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xc);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_330,"a_out[12]","a_c[12]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar2) {
    testing::Message::Message(&local_338);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xee,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,0xd);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xd);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_350,"a_out[13]","a_c[13]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar2) {
    testing::Message::Message(&local_358);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xef,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,0xe);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xe);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_370,"a_out[14]","a_c[14]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_198,0xf);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xf);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_390,"a_out[15]","a_c[15]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  qpixl::frqi::invGrayPermutation<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)local_20);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_3b0,"a[ 0]","a_c[ 0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,1);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,1);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_3d0,"a[ 1]","a_c[ 1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,2);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_3f0,"a[ 2]","a_c[ 2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar2) {
    testing::Message::Message(&local_3f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,3);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,3);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_410,"a[ 3]","a_c[ 3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar2) {
    testing::Message::Message(&local_418);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,4);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_430,"a[ 4]","a_c[ 4]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar2) {
    testing::Message::Message(&local_438);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,5);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,5);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_450,"a[ 5]","a_c[ 5]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar2) {
    testing::Message::Message(&local_458);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xf9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,6);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,6);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_470,"a[ 6]","a_c[ 6]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar2) {
    testing::Message::Message(&local_478);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xfa,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,7);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,7);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_490,"a[ 7]","a_c[ 7]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xfb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,8);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,8);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4b0,"a[ 8]","a_c[ 8]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xfc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,9);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,9);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4d0,"a[ 9]","a_c[ 9]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar2) {
    testing::Message::Message(&local_4d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xfd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,10);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,10);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4f0,"a[10]","a_c[10]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar2) {
    testing::Message::Message(&local_4f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xfe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,0xb);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xb);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_510,"a[11]","a_c[11]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar2) {
    testing::Message::Message(&local_518);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xff,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,0xc);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xc);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_530,"a[12]","a_c[12]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar2) {
    testing::Message::Message(&local_538);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x100,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,0xd);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xd);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_550,"a[13]","a_c[13]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar2) {
    testing::Message::Message(&local_558);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x101,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,0xe);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xe);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_570,"a[14]","a_c[14]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar2) {
    testing::Message::Message(&local_578);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x102,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_20,0xf);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_e8,0xf);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_590,"a[15]","a_c[15]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x103,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_198);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_20);
  return;
}

Assistant:

void test_qpixl_frqi_util_inv_gray_permutation() {
  std::vector< R > a = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 , 
                         10 , 11 , 12 , 13 , 14 , 15 , 16  } ;
  std::vector< R > a_c = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 , 
                         10 , 11 , 12 , 13 , 14 , 15 , 16 };
  std::vector< R > a_out( 16 ) ;
  qpixl::frqi::grayPermutation( a ) ;
    {
    // with copy
    qpixl::frqi::invGrayPermutation( a , a_out ) ;
    EXPECT_EQ( a_out[ 0] , a_c[ 0] );
    EXPECT_EQ( a_out[ 1] , a_c[ 1] );
    EXPECT_EQ( a_out[ 2] , a_c[ 2] );
    EXPECT_EQ( a_out[ 3] , a_c[ 3] );
    EXPECT_EQ( a_out[ 4] , a_c[ 4] );
    EXPECT_EQ( a_out[ 5] , a_c[ 5] );
    EXPECT_EQ( a_out[ 6] , a_c[ 6] );
    EXPECT_EQ( a_out[ 7] , a_c[ 7] );
    EXPECT_EQ( a_out[ 8] , a_c[ 8] );
    EXPECT_EQ( a_out[ 9] , a_c[ 9] );
    EXPECT_EQ( a_out[10] , a_c[10] );
    EXPECT_EQ( a_out[11] , a_c[11] );
    EXPECT_EQ( a_out[12] , a_c[12] );
    EXPECT_EQ( a_out[13] , a_c[13] );
    EXPECT_EQ( a_out[14] , a_c[14] );
    EXPECT_EQ( a_out[15] , a_c[15] );
    // in-place
    qpixl::frqi::invGrayPermutation( a ) ;
    EXPECT_EQ( a[ 0] , a_c[ 0] );
    EXPECT_EQ( a[ 1] , a_c[ 1] );
    EXPECT_EQ( a[ 2] , a_c[ 2] );
    EXPECT_EQ( a[ 3] , a_c[ 3] );
    EXPECT_EQ( a[ 4] , a_c[ 4] );
    EXPECT_EQ( a[ 5] , a_c[ 5] );
    EXPECT_EQ( a[ 6] , a_c[ 6] );
    EXPECT_EQ( a[ 7] , a_c[ 7] );
    EXPECT_EQ( a[ 8] , a_c[ 8] );
    EXPECT_EQ( a[ 9] , a_c[ 9] );
    EXPECT_EQ( a[10] , a_c[10] );
    EXPECT_EQ( a[11] , a_c[11] );
    EXPECT_EQ( a[12] , a_c[12] );
    EXPECT_EQ( a[13] , a_c[13] );
    EXPECT_EQ( a[14] , a_c[14] );
    EXPECT_EQ( a[15] , a_c[15] );
  }

}